

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureAllocationTestCase::verifyTexStorageVirtualPageSizeIndexError
          (SparseTextureAllocationTestCase *this,Functions *gl,GLint target,GLint format)

{
  GLuint GVar1;
  bool bVar2;
  GLenum GVar3;
  int local_34;
  GLuint local_30;
  GLint numPageSizes;
  GLint depth;
  GLuint texture;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTextureAllocationTestCase *this_local;
  
  depth = format;
  texture = target;
  _format_local = gl;
  gl_local = (Functions *)this;
  std::operator<<((ostream *)&this->field_0x88,"Verify VirtualPageSizeIndex errors - ");
  gl4cts::Texture::Generate(_format_local,(GLuint *)&numPageSizes);
  gl4cts::Texture::Bind(_format_local,numPageSizes,texture);
  (*_format_local->texParameteri)(texture,0x91a6,1);
  GVar1 = texture;
  GVar3 = (*_format_local->getError)();
  bVar2 = SparseTextureUtils::verifyQueryError(&this->mLog,"texParameteri",GVar1,0x91a6,GVar3,0);
  if (bVar2) {
    (*_format_local->getInternalformativ)(texture,depth,0x91a8,4,&local_34);
    GVar1 = texture;
    GVar3 = (*_format_local->getError)();
    bVar2 = SparseTextureUtils::verifyQueryError
                      (&this->mLog,"getInternalformativ",GVar1,0x91a8,GVar3,0);
    if (bVar2) {
      local_34 = local_34 + 1;
      (*_format_local->texParameteri)(texture,0x91a7,local_34);
      GVar1 = texture;
      GVar3 = (*_format_local->getError)();
      bVar2 = SparseTextureUtils::verifyQueryError(&this->mLog,"texParameteri",GVar1,0x91a7,GVar3,0)
      ;
      if (bVar2) {
        local_30 = SparseTextureUtils::getTargetDepth(texture);
        gl4cts::Texture::Storage(_format_local,texture,1,depth,8,8,local_30);
        GVar3 = (*_format_local->getError)();
        bVar2 = SparseTextureUtils::verifyError(&this->mLog,"TexStorage",GVar3,0);
        if (bVar2) {
          gl4cts::Texture::Delete(_format_local,(GLuint *)&numPageSizes);
          this_local._7_1_ = true;
        }
        else {
          gl4cts::Texture::Delete(_format_local,(GLuint *)&numPageSizes);
          this_local._7_1_ = false;
        }
      }
      else {
        gl4cts::Texture::Delete(_format_local,(GLuint *)&numPageSizes);
        this_local._7_1_ = false;
      }
    }
    else {
      gl4cts::Texture::Delete(_format_local,(GLuint *)&numPageSizes);
      this_local._7_1_ = false;
    }
  }
  else {
    gl4cts::Texture::Delete(_format_local,(GLuint *)&numPageSizes);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SparseTextureAllocationTestCase::verifyTexStorageVirtualPageSizeIndexError(const Functions& gl, GLint target,
																				GLint format)
{
	mLog << "Verify VirtualPageSizeIndex errors - ";

	GLuint texture;
	GLint  depth;
	GLint  numPageSizes;

	Texture::Generate(gl, texture);
	Texture::Bind(gl, texture, target);

	gl.texParameteri(target, GL_TEXTURE_SPARSE_ARB, GL_TRUE);
	if (!SparseTextureUtils::verifyQueryError(mLog, "texParameteri", target, GL_TEXTURE_SPARSE_ARB, gl.getError(),
											  GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	gl.getInternalformativ(target, format, GL_NUM_VIRTUAL_PAGE_SIZES_ARB, sizeof(numPageSizes), &numPageSizes);
	if (!SparseTextureUtils::verifyQueryError(mLog, "getInternalformativ", target, GL_NUM_VIRTUAL_PAGE_SIZES_ARB,
											  gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	numPageSizes += 1;
	gl.texParameteri(target, GL_VIRTUAL_PAGE_SIZE_INDEX_ARB, numPageSizes);
	if (!SparseTextureUtils::verifyQueryError(mLog, "texParameteri", target, GL_VIRTUAL_PAGE_SIZE_INDEX_ARB,
											  gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	depth = SparseTextureUtils::getTargetDepth(target);

	Texture::Storage(gl, target, 1, format, 8, 8, depth);
	if (!SparseTextureUtils::verifyError(mLog, "TexStorage", gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	Texture::Delete(gl, texture);
	return true;
}